

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O2

bool __thiscall
glcts::TextureBufferTextureBufferRange::checkResult
          (TextureBufferTextureBufferRange *this,FormatInfo *info,char *phase,bool transformFeedback
          )

{
  GLuint GVar1;
  GLenum GVar2;
  GLuint *pGVar3;
  undefined8 uVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  int *piVar8;
  char *pcVar9;
  long lVar10;
  TestError *this_00;
  undefined7 in_register_00000009;
  undefined4 uVar11;
  GLuint *pGVar12;
  TextureBufferTextureBufferRange *pTVar13;
  ulong uVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  vector<float,_std::allocator<float>_> expected;
  allocator_type local_390 [40];
  char *local_368 [4];
  Context *local_348;
  stringstream expVal;
  ostringstream local_338 [8];
  undefined1 local_330 [8];
  string local_328 [368];
  stringstream resVal;
  undefined1 local_1a8 [8];
  string local_1a0 [368];
  Context *pCVar7;
  
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pCVar7 = (Context *)CONCAT44(extraout_var,iVar5);
  pGVar3 = &this->m_tf_value_buffer_id;
  pGVar12 = &this->m_tf_size_buffer_id;
  bVar15 = (int)CONCAT71(in_register_00000009,transformFeedback) != 0;
  if (!bVar15) {
    pGVar12 = &this->m_ssbo_size_id;
    pGVar3 = &this->m_ssbo_value_id;
  }
  uVar11 = 0x90d2;
  if (bVar15) {
    uVar11 = 0x8c8e;
  }
  GVar1 = *pGVar3;
  (*(code *)pCVar7[2].m_testCtx)(uVar11,*pGVar12);
  dVar6 = (*(code *)pCVar7[0x40].m_testCtx)();
  glu::checkError(dVar6,"Error binding buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x437);
  piVar8 = (int *)(*(code *)pCVar7[0x68].m_testCtx)(uVar11,0,4,1);
  dVar6 = (*(code *)pCVar7[0x40].m_testCtx)();
  glu::checkError(dVar6,"Error mapping buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x43a);
  if (*piVar8 != 1) {
    _expVal = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_338);
    std::operator<<((ostream *)local_338,"Texture size is wrong for ");
    std::operator<<((ostream *)local_338,phase);
    std::operator<<((ostream *)local_338," phase \n");
    std::operator<<((ostream *)local_338,"Internal Format: ");
    pcVar9 = glu::getUncompressedTextureFormatName(info->m_internal_format);
    std::operator<<((ostream *)local_338,pcVar9);
    std::operator<<((ostream *)local_338,"\n");
    std::operator<<((ostream *)local_338,"Expected size:   ");
    std::ostream::operator<<(local_338,1);
    std::operator<<((ostream *)local_338,"\n");
    std::operator<<((ostream *)local_338,"Result size:     ");
    std::ostream::_M_insert<void_const*>(local_338);
    std::operator<<((ostream *)local_338,"\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&expVal,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_338);
  }
  (*(code *)pCVar7[0xb3].m_contextInfo)(uVar11);
  dVar6 = (*(code *)pCVar7[0x40].m_testCtx)();
  glu::checkError(dVar6,"Error unmapping buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,1099);
  (*(code *)pCVar7[2].m_testCtx)(uVar11,GVar1);
  dVar6 = (*(code *)pCVar7[0x40].m_testCtx)();
  glu::checkError(dVar6,"Error binding buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x44e);
  std::__cxx11::stringstream::stringstream((stringstream *)&expVal);
  std::__cxx11::stringstream::stringstream((stringstream *)&resVal);
  GVar2 = info->m_output_type;
  local_390._32_4_ = uVar11;
  local_348 = pCVar7;
  if (GVar2 == 0x1404) {
    lVar10 = (*(code *)pCVar7[0x68].m_testCtx)(uVar11,0,info->m_ssbo_value_size,1);
    dVar6 = (*(code *)pCVar7[0x40].m_testCtx)();
    glu::checkError(dVar6,"Error mapping buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x475);
    pTVar13 = (TextureBufferTextureBufferRange *)&expected;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)pTVar13,(ulong)info->m_n_components,
               (allocator_type *)local_390);
    fillOutputData(pTVar13,(GLubyte *)
                           expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start,info);
    bVar15 = true;
    for (uVar14 = 0; uVar14 < info->m_n_components; uVar14 = uVar14 + 1) {
      if (*(float *)(lVar10 + uVar14 * 4) !=
          expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar14]) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_390,fixed_sample_locations_values + 1,
                   (allocator<char> *)local_368);
        std::__cxx11::stringbuf::str(local_328);
        std::__cxx11::string::~string((string *)local_390);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_390,fixed_sample_locations_values + 1,
                   (allocator<char> *)local_368);
        std::__cxx11::stringbuf::str(local_1a0);
        std::__cxx11::string::~string((string *)local_390);
        std::ostream::operator<<
                  (local_330,
                   (int)expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar14]);
        std::ostream::operator<<(local_1a8,*(int *)(lVar10 + uVar14 * 4));
        pcVar9 = glu::getUncompressedTextureFormatName(info->m_internal_format);
        std::__cxx11::stringbuf::str();
        uVar4 = local_390._0_8_;
        std::__cxx11::stringbuf::str();
        logError(this,phase,pcVar9,(GLuint)uVar14,(char *)uVar4,local_368[0]);
        std::__cxx11::string::~string((string *)local_368);
        std::__cxx11::string::~string((string *)local_390);
        bVar15 = false;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&expected);
  }
  else if (GVar2 == 0x1405) {
    lVar10 = (*(code *)pCVar7[0x68].m_testCtx)(uVar11,0,info->m_ssbo_value_size,1);
    dVar6 = (*(code *)pCVar7[0x40].m_testCtx)();
    glu::checkError(dVar6,"Error mapping buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x491);
    pTVar13 = (TextureBufferTextureBufferRange *)&expected;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pTVar13,
               (ulong)info->m_n_components,(allocator_type *)local_390);
    fillOutputData(pTVar13,(GLubyte *)
                           expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start,info);
    bVar15 = true;
    for (uVar14 = 0; uVar14 < info->m_n_components; uVar14 = uVar14 + 1) {
      if (*(float *)(lVar10 + uVar14 * 4) !=
          expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar14]) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_390,fixed_sample_locations_values + 1,
                   (allocator<char> *)local_368);
        std::__cxx11::stringbuf::str(local_328);
        std::__cxx11::string::~string((string *)local_390);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_390,fixed_sample_locations_values + 1,
                   (allocator<char> *)local_368);
        std::__cxx11::stringbuf::str(local_1a0);
        std::__cxx11::string::~string((string *)local_390);
        std::ostream::_M_insert<unsigned_long>((ulong)local_330);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        pcVar9 = glu::getUncompressedTextureFormatName(info->m_internal_format);
        std::__cxx11::stringbuf::str();
        uVar4 = local_390._0_8_;
        std::__cxx11::stringbuf::str();
        logError(this,phase,pcVar9,(GLuint)uVar14,(char *)uVar4,local_368[0]);
        std::__cxx11::string::~string((string *)local_368);
        std::__cxx11::string::~string((string *)local_390);
        bVar15 = false;
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&expected);
  }
  else {
    if (GVar2 != 0x1406) {
      (*(code *)pCVar7[0xb3].m_contextInfo)(uVar11);
      dVar6 = (*(code *)pCVar7[0x40].m_testCtx)();
      glu::checkError(dVar6,"Error ummapping buffer!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x4ac);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not allowed output type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                 ,0x4ae);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar10 = (*(code *)pCVar7[0x68].m_testCtx)(uVar11,0,info->m_ssbo_value_size,1);
    dVar6 = (*(code *)pCVar7[0x40].m_testCtx)();
    glu::checkError(dVar6,"Error mapping buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x45a);
    pTVar13 = (TextureBufferTextureBufferRange *)&expected;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)pTVar13,(ulong)info->m_n_components,
               local_390);
    fillOutputData(pTVar13,(GLubyte *)
                           expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start,info);
    local_390._36_4_ = 0.0001;
    bVar15 = true;
    for (uVar14 = 0; uVar14 < info->m_n_components; uVar14 = uVar14 + 1) {
      fVar16 = *(float *)(lVar10 + uVar14 * 4) -
               expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
      fVar17 = -fVar16;
      if (-fVar16 <= fVar16) {
        fVar17 = fVar16;
      }
      if ((float)local_390._36_4_ < fVar17) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_390,fixed_sample_locations_values + 1,
                   (allocator<char> *)local_368);
        std::__cxx11::stringbuf::str(local_328);
        std::__cxx11::string::~string((string *)local_390);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_390,fixed_sample_locations_values + 1,
                   (allocator<char> *)local_368);
        std::__cxx11::stringbuf::str(local_1a0);
        std::__cxx11::string::~string((string *)local_390);
        std::ostream::operator<<
                  (local_330,
                   expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14]);
        std::ostream::operator<<(local_1a8,*(float *)(lVar10 + uVar14 * 4));
        pcVar9 = glu::getUncompressedTextureFormatName(info->m_internal_format);
        std::__cxx11::stringbuf::str();
        uVar4 = local_390._0_8_;
        std::__cxx11::stringbuf::str();
        logError(this,phase,pcVar9,(GLuint)uVar14,(char *)uVar4,local_368[0]);
        std::__cxx11::string::~string((string *)local_368);
        std::__cxx11::string::~string((string *)local_390);
        bVar15 = false;
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&expected.super__Vector_base<float,_std::allocator<float>_>);
  }
  pCVar7 = local_348;
  (*(code *)local_348[0xb3].m_contextInfo)(local_390._32_4_);
  dVar6 = (*(code *)pCVar7[0x40].m_testCtx)();
  glu::checkError(dVar6,"Error ummapping buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x4b3);
  std::__cxx11::stringstream::~stringstream((stringstream *)&resVal);
  std::__cxx11::stringstream::~stringstream((stringstream *)&expVal);
  return bVar15;
}

Assistant:

bool TextureBufferTextureBufferRange::checkResult(FormatInfo& info, const char* phase, bool transformFeedback)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLenum bufferTarget  = GL_NONE;
	glw::GLuint bufferSizeId  = GL_NONE;
	glw::GLuint bufferValueId = GL_NONE;

	if (transformFeedback)
	{
		bufferTarget  = GL_TRANSFORM_FEEDBACK_BUFFER;
		bufferSizeId  = m_tf_size_buffer_id;
		bufferValueId = m_tf_value_buffer_id;
	}
	else
	{
		bufferTarget  = GL_SHADER_STORAGE_BUFFER;
		bufferSizeId  = m_ssbo_size_id;
		bufferValueId = m_ssbo_value_id;
	}

	bool testResult = true;

	/* Get result data */
	gl.bindBuffer(bufferTarget, bufferSizeId);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer!");

	glw::GLint* size = (glw::GLint*)gl.mapBufferRange(bufferTarget, 0, sizeof(glw::GLint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

	const glw::GLint expectedSize = 1;

	/* Reagrding test specification size should be equal 1*/
	/* Log error if expected and result data are not equal */
	if (*size != expectedSize)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Texture size is wrong for " << phase << " phase \n"
						   << "Internal Format: " << glu::getUncompressedTextureFormatName(info.get_internal_format())
						   << "\n"
						   << "Expected size:   " << expectedSize << "\n"
						   << "Result size:     " << size << "\n"
						   << tcu::TestLog::EndMessage;
	}

	gl.unmapBuffer(bufferTarget);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer!");

	gl.bindBuffer(bufferTarget, bufferValueId);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer!");

	std::stringstream expVal;
	std::stringstream resVal;

	/* Log error if expected and result data are not equal */
	switch (info.get_output_type())
	{
	case GL_FLOAT:
	{
		glw::GLfloat* res =
			(glw::GLfloat*)gl.mapBufferRange(bufferTarget, 0, info.get_ssbo_value_size(), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

		std::vector<glw::GLfloat> expected(info.get_n_components());

		fillOutputData(reinterpret_cast<glw::GLubyte*>(&expected[0]), info);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			if (de::abs(res[i] - expected[i]) > m_epsilon_float)
			{
				expVal.str("");
				resVal.str("");
				expVal << expected[i];
				resVal << res[i];

				logError(phase, glu::getUncompressedTextureFormatName(info.get_internal_format()), i,
						 expVal.str().c_str(), resVal.str().c_str());

				testResult = false;
			}
		}
	}
	break;

	case GL_INT:
	{
		glw::GLint* res = (glw::GLint*)gl.mapBufferRange(bufferTarget, 0, info.get_ssbo_value_size(), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

		std::vector<glw::GLint> expected(info.get_n_components());

		fillOutputData(reinterpret_cast<glw::GLubyte*>(&expected[0]), info);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			if (res[i] != expected[i])
			{
				expVal.str("");
				resVal.str("");
				expVal << expected[i];
				resVal << res[i];

				logError(phase, glu::getUncompressedTextureFormatName(info.get_internal_format()), i,
						 expVal.str().c_str(), resVal.str().c_str());

				testResult = false;
			}
		}
	}
	break;

	case GL_UNSIGNED_INT:
	{
		glw::GLuint* res =
			(glw::GLuint*)gl.mapBufferRange(bufferTarget, 0, info.get_ssbo_value_size(), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

		std::vector<glw::GLuint> expected(info.get_n_components());

		fillOutputData(reinterpret_cast<glw::GLubyte*>(&expected[0]), info);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			if (res[i] != expected[i])
			{
				expVal.str("");
				resVal.str("");
				expVal << expected[i];
				resVal << res[i];

				logError(phase, glu::getUncompressedTextureFormatName(info.get_internal_format()), i,
						 expVal.str().c_str(), resVal.str().c_str());

				testResult = false;
			}
		}
	}
	break;

	default:
	{
		gl.unmapBuffer(bufferTarget);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping buffer!");

		TCU_FAIL("Not allowed output type");
	}
	}

	gl.unmapBuffer(bufferTarget);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping buffer!");

	return testResult;
}